

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O2

int __thiscall
CServerBrowserFilter::AddFilter(CServerBrowserFilter *this,CServerFilterInfo *pFilterInfo)

{
  int iVar1;
  long in_FS_OFFSET;
  CServerFilter local_100;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CServerFilter::CServerFilter(&local_100);
  CServerFilterInfo::Set(&local_100.m_FilterInfo,pFilterInfo);
  local_100.m_SortedServersCapacity = 0;
  local_100.m_NumSortedPlayers = 0;
  local_100.m_NumSortedServers = 0;
  local_100.m_pSortedServerlist = (int *)0x0;
  local_100.m_pServerBrowserFilter = this;
  array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
  ::add(&this->m_lFilters,&local_100);
  iVar1 = (this->m_lFilters).num_elements;
  CServerFilter::~CServerFilter(&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1 + -1;
  }
  __stack_chk_fail();
}

Assistant:

int CServerBrowserFilter::AddFilter(const CServerFilterInfo *pFilterInfo)
{
	CServerFilter Filter;
	Filter.m_FilterInfo.Set(pFilterInfo);
	Filter.m_pSortedServerlist = 0;
	Filter.m_NumSortedPlayers = 0;
	Filter.m_NumSortedServers = 0;
	Filter.m_SortedServersCapacity = 0;
	Filter.m_pServerBrowserFilter = this;
	m_lFilters.add(Filter);

	return m_lFilters.size()-1;
}